

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

KeyInfo * keyInfoFromExprList(Parse *pParse,ExprList *pList)

{
  int iVar1;
  sqlite3 *db_00;
  KeyInfo *pKVar2;
  CollSeq *local_48;
  CollSeq *pColl;
  ExprList_item *pEStack_38;
  int i;
  ExprList_item *pItem;
  KeyInfo *pInfo;
  int nExpr;
  sqlite3 *db;
  ExprList *pList_local;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  iVar1 = pList->nExpr;
  pKVar2 = (KeyInfo *)sqlite3DbMallocZero(db_00,iVar1 * 9 + 0x20);
  if (pKVar2 != (KeyInfo *)0x0) {
    pKVar2->aSortOrder = (u8 *)(pKVar2->aColl + iVar1);
    pKVar2->nField = (u16)iVar1;
    pKVar2->enc = db_00->aDb->pSchema->enc;
    pKVar2->db = db_00;
    pColl._4_4_ = 0;
    pEStack_38 = pList->a;
    for (; pColl._4_4_ < iVar1; pColl._4_4_ = pColl._4_4_ + 1) {
      local_48 = sqlite3ExprCollSeq(pParse,pEStack_38->pExpr);
      if (local_48 == (CollSeq *)0x0) {
        local_48 = db_00->pDfltColl;
      }
      pKVar2->aColl[pColl._4_4_] = local_48;
      pKVar2->aSortOrder[pColl._4_4_] = pEStack_38->sortOrder;
      pEStack_38 = pEStack_38 + 1;
    }
  }
  return pKVar2;
}

Assistant:

static KeyInfo *keyInfoFromExprList(Parse *pParse, ExprList *pList){
  sqlite3 *db = pParse->db;
  int nExpr;
  KeyInfo *pInfo;
  struct ExprList_item *pItem;
  int i;

  nExpr = pList->nExpr;
  pInfo = sqlite3DbMallocZero(db, sizeof(*pInfo) + nExpr*(sizeof(CollSeq*)+1) );
  if( pInfo ){
    pInfo->aSortOrder = (u8*)&pInfo->aColl[nExpr];
    pInfo->nField = (u16)nExpr;
    pInfo->enc = ENC(db);
    pInfo->db = db;
    for(i=0, pItem=pList->a; i<nExpr; i++, pItem++){
      CollSeq *pColl;
      pColl = sqlite3ExprCollSeq(pParse, pItem->pExpr);
      if( !pColl ){
        pColl = db->pDfltColl;
      }
      pInfo->aColl[i] = pColl;
      pInfo->aSortOrder[i] = pItem->sortOrder;
    }
  }
  return pInfo;
}